

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void * If_ManDeriveGiaFromCells(void *pGia)

{
  ulong *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  Ifn_Ntk_t *p;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *vLeaves;
  int *piVar10;
  Vec_Int_t *vCover;
  Gia_Obj_t *pGVar11;
  long lVar12;
  Gia_Man_t *pGVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int local_50;
  
  if (*(long *)((long)pGia + 0x138) == 0) {
    __assert_fail("p->vConfigs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x344,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(char **)((long)pGia + 0x140) == (char *)0x0) {
    __assert_fail("p->pCellStr != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x345,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(long *)((long)pGia + 0x108) == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x346,"void *If_ManDeriveGiaFromCells(void *)");
  }
  p = Ifn_NtkParse(*(char **)((long)pGia + 0x140));
  Ifn_Prepare(p,(word *)0x0,p->nInps);
  if (1 < *(int *)(*(long *)((long)pGia + 0x138) + 4)) {
    iVar6 = *(int *)(*(long *)(*(long *)((long)pGia + 0x138) + 8) + 4);
    p_00 = Gia_ManStart((*(int *)((long)pGia + 0x18) * 6) / 5 + 100);
    pcVar4 = *pGia;
    if (pcVar4 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar4);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar4);
    }
    p_00->pName = pcVar8;
    pcVar4 = *(char **)((long)pGia + 8);
    if (pcVar4 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar4);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar4);
    }
    p_00->pSpec = pcVar8;
    Gia_ManFillValue((Gia_Man_t *)pGia);
    *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
    lVar17 = *(long *)((long)pGia + 0x40);
    if (0 < *(int *)(lVar17 + 4)) {
      lVar16 = 0;
      do {
        iVar5 = *(int *)(*(long *)(lVar17 + 8) + lVar16 * 4);
        if (((long)iVar5 < 0) || (*(int *)((long)pGia + 0x18) <= iVar5)) goto LAB_0043c07d;
        lVar17 = *(long *)((long)pGia + 0x20);
        if (lVar17 == 0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar14 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar14 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar14 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar11 = p_00->pObjs;
        if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_0043c0bb;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * -0x55555555);
        pGVar11 = p_00->pObjs;
        if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_0043c0bb;
        *(int *)(lVar17 + 8 + (long)iVar5 * 0xc) =
             (int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * 0x55555556;
        lVar16 = lVar16 + 1;
        lVar17 = *(long *)((long)pGia + 0x40);
      } while (lVar16 < *(int *)(lVar17 + 4));
    }
    vLeaves = (Vec_Int_t *)malloc(0x10);
    vLeaves->nCap = 0x10;
    vLeaves->nSize = 0;
    piVar10 = (int *)malloc(0x40);
    vLeaves->pArray = piVar10;
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar10 = (int *)malloc(0x40000);
    vCover->pArray = piVar10;
    Gia_ManHashStart(p_00);
    if (*(int *)((long)pGia + 0x18) < 1) {
      local_50 = 0;
    }
    else {
      lVar17 = 0;
      local_50 = 0;
      do {
        if (*(long *)((long)pGia + 0x20) == 0) break;
        puVar1 = (ulong *)(*(long *)((long)pGia + 0x20) + lVar17 * 0xc);
        uVar14 = *puVar1;
        uVar19 = (uint)uVar14;
        if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) {
          if ((((int)uVar19 < 0) || ((uVar19 & 0x1fffffff) == 0x1fffffff)) ||
             ((uVar19 & 0x1fffffff) != ((uint)(uVar14 >> 0x20) & 0x1fffffff))) {
            if (*(int *)(*(long *)((long)pGia + 0x108) + 4) <= lVar17) goto LAB_0043c09c;
            if (*(int *)(*(long *)(*(long *)((long)pGia + 0x108) + 8) + lVar17 * 4) != 0) {
              vLeaves->nSize = 0;
              lVar16 = *(long *)((long)pGia + 0x108);
              lVar12 = (long)*(int *)(lVar16 + 4);
              if (lVar12 <= lVar17) goto LAB_0043c09c;
              lVar18 = 0;
              while( true ) {
                lVar16 = *(long *)(lVar16 + 8);
                iVar5 = *(int *)(lVar16 + lVar17 * 4);
                lVar15 = (long)iVar5;
                if ((lVar15 < 0) || ((int)lVar12 <= iVar5)) goto LAB_0043c09c;
                if (*(int *)(lVar16 + lVar15 * 4) <= lVar18) break;
                iVar5 = *(int *)(lVar16 + lVar15 * 4 + 4 + lVar18 * 4);
                if (((long)iVar5 < 0) || (*(int *)((long)pGia + 0x18) <= iVar5)) goto LAB_0043c07d;
                Vec_IntPush(vLeaves,*(int *)(*(long *)((long)pGia + 0x20) + 8 + (long)iVar5 * 0xc));
                lVar18 = lVar18 + 1;
                lVar16 = *(long *)((long)pGia + 0x108);
                lVar12 = (long)*(int *)(lVar16 + 4);
                if (lVar12 <= lVar17) goto LAB_0043c09c;
              }
              iVar5 = local_50 * iVar6;
              if (iVar5 < -2) {
LAB_0043c0f9:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              uVar19 = iVar5 + 2;
              if (*(int *)(*(long *)((long)pGia + 0x138) + 4) <= (int)uVar19) goto LAB_0043c0f9;
              iVar5 = If_ManSatDeriveGiaFromBits
                                (p_00,p,(word *)((ulong)uVar19 * 4 +
                                                *(long *)(*(long *)((long)pGia + 0x138) + 8)),
                                 vLeaves,vCover);
              if (*(int *)((long)pGia + 0x18) <= lVar17) goto LAB_0043c07d;
              local_50 = local_50 + 1;
              *(int *)(*(long *)((long)pGia + 0x20) + 8 + lVar17 * 0xc) = iVar5;
            }
          }
          else {
            uVar3 = *(uint *)((long)puVar1 + (uVar14 & 0x1fffffff) * -0xc + 8);
            if ((int)uVar3 < 0) goto LAB_0043c0da;
            pGVar11 = Gia_ManAppendObj(p_00);
            if (p_00->nObjs <= (int)(uVar3 >> 1)) {
              __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x30b,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
            }
            pGVar9 = p_00->pObjs;
            if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) {
LAB_0043c0bb:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar14 = (ulong)(((uint)((int)pGVar11 - (int)pGVar9) >> 2) * -0x55555555 - (uVar3 >> 1)
                            & 0x1fffffff);
            uVar19 = (uVar3 ^ uVar19 >> 0x1d) & 1;
            *(ulong *)pGVar11 =
                 (ulong)(uVar19 << 0x1d) |
                 (ulong)uVar19 << 0x3d | *(ulong *)pGVar11 & 0xc0000000c0000000 | uVar14 << 0x20 |
                 uVar14;
            p_00->nBufs = p_00->nBufs + 1;
            pGVar9 = p_00->pObjs;
            if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) goto LAB_0043c0bb;
            *(int *)(puVar1 + 1) = (int)((ulong)((long)pGVar11 - (long)pGVar9) >> 2) * 0x55555556;
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < *(int *)((long)pGia + 0x18));
    }
    iVar5 = *(int *)(*(long *)((long)pGia + 0x138) + 4);
    if (0 < iVar5) {
      if (**(int **)(*(long *)((long)pGia + 0x138) + 8) != local_50) {
        __assert_fail("Vec_IntEntry(p->vConfigs, 0) == Count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x36e,"void *If_ManDeriveGiaFromCells(void *)");
      }
      if (iVar5 != local_50 * iVar6 + 2) {
        __assert_fail("Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x36f,"void *If_ManDeriveGiaFromCells(void *)");
      }
      lVar17 = *(long *)((long)pGia + 0x48);
      if (0 < *(int *)(lVar17 + 4)) {
        lVar16 = 0;
        do {
          iVar6 = *(int *)(*(long *)(lVar17 + 8) + lVar16 * 4);
          if (((long)iVar6 < 0) || (*(int *)((long)pGia + 0x18) <= iVar6)) {
LAB_0043c07d:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (*(long *)((long)pGia + 0x20) == 0) break;
          puVar2 = (undefined8 *)(*(long *)((long)pGia + 0x20) + (long)iVar6 * 0xc);
          uVar19 = *(uint *)((long)puVar2 + (ulong)((uint)*puVar2 & 0x1fffffff) * -0xc + 8);
          if ((int)uVar19 < 0) {
LAB_0043c0da:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar6 = Gia_ManAppendCo(p_00,(uint)*puVar2 >> 0x1d & 1 ^ uVar19);
          *(int *)(puVar2 + 1) = iVar6;
          lVar16 = lVar16 + 1;
          lVar17 = *(long *)((long)pGia + 0x48);
        } while (lVar16 < *(int *)(lVar17 + 4));
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,*(int *)((long)pGia + 0x10));
      if (vLeaves->pArray != (int *)0x0) {
        free(vLeaves->pArray);
        vLeaves->pArray = (int *)0x0;
      }
      free(vLeaves);
      if (vCover->pArray != (int *)0x0) {
        free(vCover->pArray);
        vCover->pArray = (int *)0x0;
      }
      free(vCover);
      free(p);
      pGVar13 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar13;
    }
  }
LAB_0043c09c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void * If_ManDeriveGiaFromCells( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vCover, * vLeaves;
    Ifn_Ntk_t * pNtkCell;
    Gia_Obj_t * pObj; 
    word * pConfigData;
    //word * pTruth;
    int k, i, iLut, iVar;
    int nConfigInts, Count = 0;
    assert( p->vConfigs != NULL );
    assert( p->pCellStr != NULL );
    assert( Gia_ManHasMapping(p) );
    // derive cell network
    pNtkCell = Ifn_NtkParse( p->pCellStr );
    Ifn_Prepare( pNtkCell, NULL, pNtkCell->nInps );
    nConfigInts = Vec_IntEntry( p->vConfigs, 1 );
    // create new manager
    pNew = Gia_ManStart( 6*Gia_ManObjNum(p)/5 + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map primary inputs
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // iterate through nodes used in the mapping
    vLeaves = Vec_IntAlloc( 16 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    Gia_ManHashStart( pNew );
    //Gia_ObjComputeTruthTableStart( p, Gia_ManLutSizeMax(p) );
    Gia_ManForEachAnd( p, pObj, iLut )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            continue;
        }
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        // collect leaves
        //Vec_IntClear( vLeaves );
        //Gia_LutForEachFanin( p, iLut, iVar, k )
        //    Vec_IntPush( vLeaves, iVar );
        //pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, iLut), vLeaves );
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, Gia_ManObj(p, iVar)->Value );
        pConfigData = (word *)Vec_IntEntryP( p->vConfigs, 2 + nConfigInts * Count++ );
        Gia_ManObj(p, iLut)->Value = If_ManSatDeriveGiaFromBits( pNew, pNtkCell, pConfigData, vLeaves, vCover );
    }
    assert( Vec_IntEntry(p->vConfigs, 0) == Count );
    assert( Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count );
    //Gia_ObjComputeTruthTableStop( p );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    ABC_FREE( pNtkCell );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;

}